

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.h
# Opt level: O3

void __thiscall units::bad_parser::~bad_parser(bad_parser *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__bad_parser_0013f3a0;
  pcVar1 = (this->msg_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->msg_).field_2) {
    operator_delete(pcVar1);
  }
  std::exception::~exception(&this->super_exception);
  operator_delete(this);
  return;
}

Assistant:

bad_parser(const char* msg) : msg_(msg) {}